

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereUsablePartialIndex(int iTab,WhereClause *pWC,Expr *pWhere)

{
  sqlite3 *pE1;
  int iVar1;
  Expr *pExpr;
  Parse *pParse;
  WhereTerm *pTerm;
  Expr *pEStack_20;
  int i;
  Expr *pWhere_local;
  WhereClause *pWC_local;
  int iTab_local;
  
  pExpr = (Expr *)pWC->pWInfo->pParse;
  for (pEStack_20 = pWhere; pEStack_20->op == ','; pEStack_20 = pEStack_20->pRight) {
    iVar1 = whereUsablePartialIndex(iTab,pWC,pEStack_20->pLeft);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if ((((Parse *)pExpr)->db->flags & 0x800000) != 0) {
    pExpr = (Expr *)0x0;
  }
  pTerm._4_4_ = 0;
  pParse = (Parse *)pWC->a;
  while( true ) {
    if (pWC->nTerm <= pTerm._4_4_) {
      return 0;
    }
    pE1 = pParse->db;
    if (((((ulong)pE1->pVfs & 0x100000000) == 0) || (*(i16 *)((long)&pE1->flags + 4) == iTab)) &&
       (iVar1 = sqlite3ExprImpliesExpr((Parse *)pExpr,(Expr *)pE1,pEStack_20,iTab), iVar1 != 0))
    break;
    pTerm._4_4_ = pTerm._4_4_ + 1;
    pParse = (Parse *)&pParse->iSelfTab;
  }
  return 1;
}

Assistant:

static int whereUsablePartialIndex(int iTab, WhereClause *pWC, Expr *pWhere){
  int i;
  WhereTerm *pTerm;
  Parse *pParse = pWC->pWInfo->pParse;
  while( pWhere->op==TK_AND ){
    if( !whereUsablePartialIndex(iTab,pWC,pWhere->pLeft) ) return 0;
    pWhere = pWhere->pRight;
  }
  if( pParse->db->flags & SQLITE_EnableQPSG ) pParse = 0;
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr = pTerm->pExpr;
    if( (!ExprHasProperty(pExpr, EP_FromJoin) || pExpr->iRightJoinTable==iTab)
     && sqlite3ExprImpliesExpr(pParse, pExpr, pWhere, iTab) 
    ){
      return 1;
    }
  }
  return 0;
}